

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
jessilib::make_json_string<wchar_t,wchar_t>
          (jessilib *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *out_string,
          u8string_view in_string)

{
  wchar_t __c;
  undefined8 in_RAX;
  char8_t *pcVar1;
  char8_t *extraout_RDX;
  char8_t *pcVar2;
  long lVar3;
  char8_t *extraout_RDX_00;
  char8_t *extraout_RDX_01;
  char8_t *pcVar4;
  char8_t *pcVar5;
  decode_result dVar6;
  __integer_to_chars_result_type<unsigned_int> _Var7;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  char data [2];
  undefined8 uStack_38;
  
  pcVar5 = (char8_t *)in_string._M_len;
  uStack_38 = in_RAX;
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::reserve
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)this,
             (long)&(out_string->_M_dataplus)._M_p + *(long *)(this + 8) + 2);
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  push_back((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)this,L'\"'
           );
  in_string_00._M_str = extraout_RDX;
  in_string_00._M_len = (size_t)pcVar5;
  dVar6 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_00);
  pcVar2 = (char8_t *)dVar6.units;
  if (pcVar2 != (char8_t *)0x0) {
    __c = dVar6.codepoint;
    do {
      if (__c == L'\"') {
        lVar3 = *(long *)(this + 8) * 4 + *(long *)this;
        pcVar1 = "\\\"";
        pcVar4 = "";
LAB_00173782:
        std::__cxx11::wstring::_M_replace_dispatch<char8_t_const*>
                  ((wstring *)this,lVar3,lVar3,pcVar1,pcVar4);
        pcVar1 = extraout_RDX_00;
      }
      else {
        if (__c == L'\\') {
          lVar3 = *(long *)(this + 8) * 4 + *(long *)this;
          pcVar1 = "\\\\";
          pcVar4 = "";
          goto LAB_00173782;
        }
        if ((uint)__c < 0x20) {
          lVar3 = *(long *)(this + 8) * 4 + *(long *)this;
          std::__cxx11::wstring::_M_replace_dispatch<char8_t_const*>
                    ((wstring *)this,lVar3,lVar3,"\\u00","");
          if (__c != L'\0') {
            _Var7 = std::__detail::__to_chars_16<unsigned_int>
                              ((char *)((long)&uStack_38 + 6),&stack0xffffffffffffffd0,__c);
            if (_Var7.ptr == (char *)((long)&uStack_38 + 6)) {
              lVar3 = *(long *)(this + 8) * 4 + *(long *)this;
              pcVar1 = "00";
              pcVar4 = "";
            }
            else {
              if (_Var7.ptr != &stack0xffffffffffffffd0) goto LAB_001737bb;
              lVar3 = *(long *)(this + 8) * 4 + *(long *)this;
              pcVar1 = (char8_t *)((long)&uStack_38 + 6);
              pcVar4 = &stack0xffffffffffffffd0;
            }
            goto LAB_00173782;
          }
          uStack_38._0_7_ = CONCAT16(0x30,(undefined6)uStack_38);
LAB_001737bb:
          std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
          push_back((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    this,L'0');
          __c = (wchar_t)uStack_38._6_1_;
LAB_001737df:
          std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
          push_back((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    this,__c);
          pcVar1 = extraout_RDX_01;
        }
        else {
          pcVar1 = pcVar2;
          if ((uint)__c < 0x110000) goto LAB_001737df;
        }
      }
      pcVar5 = pcVar5 + (long)pcVar2;
      out_string = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   ((long)out_string - (long)pcVar2);
      in_string_01._M_str = pcVar1;
      in_string_01._M_len = (size_t)pcVar5;
      dVar6 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_01);
      pcVar2 = (char8_t *)dVar6.units;
      __c = dVar6.codepoint;
    } while (pcVar2 != (char8_t *)0x0);
  }
  std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::
  push_back((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)this,L'\"'
           );
  return;
}

Assistant:

void make_json_string(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	using namespace std::literals;
	out_string.reserve(out_string.size() + in_string.size() + 2);
	simple_append<CharT, ResultCharT>(out_string, '\"');

	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		if (decode.codepoint == U'\\') { // backslash
			simple_append<CharT, ResultCharT>(out_string, u8"\\\\"sv);
		}
		else if (decode.codepoint == U'\"') { // quotation
			simple_append<CharT, ResultCharT>(out_string, u8"\\\""sv);
		}
		else if (decode.codepoint < 0x20) { // control characters
			simple_append<CharT, ResultCharT>(out_string, u8"\\u00"sv);

			// overwrite last 2 zeroes with correct hexadecimal sequence
			char data[2]; // Will only ever use 2 chars
			char* data_end = data + sizeof(data);
			auto to_chars_result = std::to_chars(data, data_end, static_cast<uint32_t>(decode.codepoint), 16);
			if (to_chars_result.ptr == data) {
				// No bytes written
				simple_append<CharT, ResultCharT>(out_string, u8"00"sv);
			}
			else if (to_chars_result.ptr != data_end) {
				// 1 byte written
				simple_append<CharT, ResultCharT>(out_string, '0');
				simple_append<CharT, ResultCharT>(out_string, data[0]);
			}
			else {
				// 2 bytes written
				simple_append<CharT, ResultCharT>(out_string, std::u8string_view{ reinterpret_cast<char8_t*>(data), sizeof(data) });
			}
		}
		else {
			if constexpr (sizeof(CharT) == sizeof(char8_t) && sizeof(CharT) == sizeof(ResultCharT)) {
				// Valid UTF-8 sequence; copy it over
				out_string.append(reinterpret_cast<const ResultCharT*>(in_string.data()), decode.units);
			}
			else if constexpr (sizeof(CharT) == sizeof(ResultCharT)){
				// Valid UTF-8 codepoint; append it
				encode_codepoint(out_string, decode.codepoint);
			}
			else {
				// Valid UTF-8 codepoint; encode & append it
				encode_buffer_type<CharT> buffer;
				size_t units_written = encode_codepoint(buffer, decode.codepoint);
				out_string.append(reinterpret_cast<ResultCharT*>(buffer), units_written * sizeof(CharT));
			}
		}

		in_string.remove_prefix(decode.units);
	}

	simple_append<CharT, ResultCharT>(out_string, '\"');
}